

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChExtruderBeamIGA::ChExtruderBeamIGA
          (ChExtruderBeamIGA *this,ChSystem *msystem,shared_ptr<chrono::fea::ChMesh> *mmesh,
          shared_ptr<chrono::fea::ChBeamSectionCosserat> *sect,double mh,ChCoordsys<double> *moutlet
          ,double mspeed,int morder)

{
  ChCoordsys<double> *mc;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  double dVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ChSystem *pCVar3;
  ChMesh *this_02;
  iterator iVar4;
  element_type *peVar5;
  element_type *peVar6;
  ChLinkMotorLinearSpeed *this_03;
  element_type *peVar7;
  _func_int **pp_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ChBody *this_04;
  ChNodeFEAxyzrot *this_05;
  ChLog *this_06;
  ChStreamOutAscii *pCVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__r;
  ChCoordsys<double> *size;
  int iVar10;
  undefined1 auVar11 [32];
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> nodeA;
  ChVector<double> v;
  value_type local_378;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  *local_368;
  ChBodyFrame *local_360;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_358;
  undefined1 *local_350;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_348;
  shared_ptr<chrono::ChPhysicsItem> local_340;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_330;
  shared_ptr<chrono::ChPhysicsItem> local_320;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_310;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_308;
  double local_300;
  shared_ptr<chrono::ChFunction> local_2f8;
  ChFrame<double> local_2e8;
  ChFrame<double> local_258;
  ChFrame<double> local_1c8;
  ChFrame<double> local_140;
  ChFrame<double> local_b8;
  
  mc = &this->outlet;
  (this->outlet).pos.m_data[0] = 0.0;
  (this->outlet).pos.m_data[1] = 0.0;
  (this->outlet).pos.m_data[2] = 0.0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_elems).
  super__Vector_base<std::shared_ptr<chrono::fea::ChElementBeamIGA>,_std::allocator<std::shared_ptr<chrono::fea::ChElementBeamIGA>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_nodes).
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar11 = ZEXT432(0) << 0x40;
  this->ground = (shared_ptr<chrono::ChBody>)auVar11._0_16_;
  this->actuator = (shared_ptr<chrono::ChLinkMotorLinearSpeed>)auVar11._16_16_;
  this->actuator = (shared_ptr<chrono::ChLinkMotorLinearSpeed>)auVar11._0_16_;
  this->guide = (shared_ptr<chrono::ChLinkMateGeneric>)auVar11._16_16_;
  auVar11 = ZEXT432(0) << 0x40;
  this->mesh = (shared_ptr<chrono::fea::ChMesh>)auVar11._0_16_;
  this->beam_section = (shared_ptr<chrono::fea::ChBeamSectionCosserat>)auVar11._16_16_;
  (this->outlet).rot.m_data[0] = 1.0;
  (this->outlet).rot.m_data[1] = 0.0;
  (this->outlet).rot.m_data[2] = 0.0;
  (this->outlet).rot.m_data[3] = 0.0;
  this->contact_material = (shared_ptr<chrono::ChMaterialSurfaceSMC>)auVar11._0_16_;
  this->contactcloud = (shared_ptr<chrono::fea::ChContactSurfaceNodeCloud>)auVar11._16_16_;
  this->beam_order = morder;
  this->h = mh;
  if (mc != moutlet) {
    (this->outlet).pos.m_data[0] = (moutlet->pos).m_data[0];
    (this->outlet).pos.m_data[1] = (moutlet->pos).m_data[1];
    (this->outlet).pos.m_data[2] = (moutlet->pos).m_data[2];
    (this->outlet).rot.m_data[0] = (moutlet->rot).m_data[0];
    (this->outlet).rot.m_data[1] = (moutlet->rot).m_data[1];
    (this->outlet).rot.m_data[2] = (moutlet->rot).m_data[2];
    (this->outlet).rot.m_data[3] = (moutlet->rot).m_data[3];
  }
  local_368 = &this->beam_nodes;
  this->mysystem = msystem;
  (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mmesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = &(this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  local_300 = mspeed;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (this_00,&(mmesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount);
  (this->beam_section).
  super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sect->super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  this_01 = &(this->beam_section).
             super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
  __r = &(sect->super___shared_ptr<chrono::fea::ChBeamSectionCosserat,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_01,__r);
  this->mytime = 0.0;
  this->speed = local_300;
  local_310 = this_01;
  local_308 = this_00;
  this_04 = (ChBody *)ChFrame<double>::operator_new((ChFrame<double> *)0x360,(size_t)__r);
  ChBody::ChBody(this_04,BULLET);
  local_2e8._vptr_ChFrame = (_func_int **)this_04;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2e8.coord,this_04);
  dVar1 = local_2e8.coord.pos.m_data[0];
  pp_Var8 = local_2e8._vptr_ChFrame;
  local_2e8._vptr_ChFrame = (_func_int **)0x0;
  local_2e8.coord.pos.m_data[0] = 0.0;
  p_Var2 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pp_Var8;
  (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar1;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0]);
  }
  ChBody::SetBodyFixed
            ((this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             true);
  local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_ChPhysicsItem;
  pCVar3 = this->mysystem;
  local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  if (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChSystem::Add(pCVar3,&local_320);
  if (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_320.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  size = mc;
  ChFrame<double>::ChFrame(&local_258,mc);
  this_05 = (ChNodeFEAxyzrot *)ChFrame<double>::operator_new((ChFrame<double> *)0x2c8,(size_t)size);
  local_2e8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_2e8.coord.pos.m_data[0] = local_258.coord.pos.m_data[0];
  local_2e8.coord.pos.m_data[1] = local_258.coord.pos.m_data[1];
  local_2e8.coord.pos.m_data[2] = local_258.coord.pos.m_data[2];
  local_2e8.coord.rot.m_data[0] = local_258.coord.rot.m_data[0];
  local_2e8.coord.rot.m_data[1] = local_258.coord.rot.m_data[1];
  local_2e8.coord.rot.m_data[2] = local_258.coord.rot.m_data[2];
  local_2e8.coord.rot.m_data[3] = local_258.coord.rot.m_data[3];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_2e8.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_258.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  ChNodeFEAxyzrot::ChNodeFEAxyzrot(this_05,&local_2e8);
  local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this_05;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::fea::ChNodeFEAxyzrot*>
            (&local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,this_05);
  peVar7 = local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_258.coord.pos.m_data[1] = this->speed;
  local_258._vptr_ChFrame = (_func_int **)(local_258.coord.pos.m_data[1] * VECT_X);
  local_258.coord.pos.m_data[0] = local_258.coord.pos.m_data[1] * DAT_00b90ad8;
  local_258.coord.pos.m_data[1] = local_258.coord.pos.m_data[1] * DAT_00b90ae0;
  ChCoordsys<double>::TransformDirectionLocalToParent(mc,(ChVector<double> *)&local_258);
  (**(code **)(*(long *)&(peVar7->super_ChNodeFEAbase).field_0x18 + 0x38))
            (&(peVar7->super_ChNodeFEAbase).field_0x18,&local_2e8);
  peVar7 = local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_2e8._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_2e8.coord.pos.m_data[0] = 0.0;
  local_2e8.coord.pos.m_data[1] = 0.0;
  local_2e8.coord.pos.m_data[2] = 0.0;
  local_b8._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
  local_b8.coord.pos.m_data[0] = 0.0;
  local_b8.coord.pos.m_data[1] = 0.0;
  local_b8.coord.pos.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[0] = 1.0;
  local_b8.coord.rot.m_data[1] = 0.0;
  local_b8.coord.rot.m_data[2] = 0.0;
  local_b8.coord.rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&local_b8.Amatrix,(ChQuaternion<double> *)&local_2e8);
  ChFrame<double>::operator=(&peVar7->X0,&local_b8);
  this_02 = (this->mesh).super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_330.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &(local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_ChNodeFEAbase;
  local_330.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChMesh::AddNode(this_02,&local_330);
  if (local_330.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
  ::push_back(local_368,&local_378);
  if (-1 < this->beam_order) {
    iVar10 = -1;
    do {
      local_2e8._vptr_ChFrame = (_func_int **)0x4059400000000000;
      iVar4._M_current =
           (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->beam_knots,iVar4,(double *)&local_2e8);
      }
      else {
        *iVar4._M_current = 101.0;
        (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar4._M_current + 1;
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 < this->beam_order);
  }
  local_2e8._vptr_ChFrame = (_func_int **)0x4059000000000000;
  iVar4._M_current =
       (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->beam_knots,iVar4,(double *)&local_2e8);
  }
  else {
    *iVar4._M_current = 100.0;
    (this->beam_knots).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar4._M_current + 1;
  }
  this_06 = GetLog();
  pCVar9 = ChStreamOutAscii::operator<<(&this_06->super_ChStreamOutAscii,"Create node n.");
  pCVar9 = ChStreamOutAscii::operator<<
                     (pCVar9,(long)(this->beam_nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->beam_nodes).
                                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  pCVar9 = ChStreamOutAscii::operator<<(pCVar9," at x=");
  pCVar9 = ChStreamOutAscii::operator<<
                     (pCVar9,*(double *)
                              &((local_378.
                                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->super_ChNodeFEAbase).field_0x20);
  pCVar9 = ChStreamOutAscii::operator<<(pCVar9," x0=");
  pCVar9 = ChStreamOutAscii::operator<<
                     (pCVar9,((local_378.
                               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr)->X0).coord.pos.m_data[0]);
  ChStreamOutAscii::operator<<(pCVar9,"\n");
  local_2e8._vptr_ChFrame = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::ChLinkMotorLinearSpeed,std::allocator<chrono::ChLinkMotorLinearSpeed>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_2e8.coord,
             (ChLinkMotorLinearSpeed **)&local_2e8,
             (allocator<chrono::ChLinkMotorLinearSpeed> *)&local_258);
  dVar1 = local_2e8.coord.pos.m_data[0];
  pp_Var8 = local_2e8._vptr_ChFrame;
  local_2e8._vptr_ChFrame = (_func_int **)0x0;
  local_2e8.coord.pos.m_data[0] = 0.0;
  p_Var2 = (this->actuator).
           super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->actuator).super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pp_Var8;
  (this->actuator).super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar1;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0] !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8.coord.pos.m_data[0]);
  }
  local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (this->actuator).
       super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar3 = this->mysystem;
  local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (this->actuator).
         super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  if (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChSystem::Add(pCVar3,&local_340);
  if (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_340.super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  peVar5 = (this->actuator).
           super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_350 = &((local_378.
                 super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->super_ChNodeFEAbase).field_0x18;
  if (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (ChNodeFEAxyzrot *)0x0) {
    local_350 = (undefined1 *)0x0;
  }
  local_348 = local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
  if (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  peVar6 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_360 = &peVar6->super_ChBodyFrame;
  if (peVar6 == (element_type *)0x0) {
    local_360 = (ChBodyFrame *)0x0;
  }
  local_358 = (this->ground).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
  if (local_358 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_358->_M_use_count = local_358->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_358->_M_use_count = local_358->_M_use_count + 1;
    }
  }
  ChFrame<double>::ChFrame(&local_140,mc);
  ChFrame<double>::ChFrame(&local_1c8,mc);
  (**(code **)(*(long *)&(peVar5->super_ChLinkMotorLinear).super_ChLinkMotor.super_ChLinkMateGeneric
                         .super_ChLinkMate.super_ChLink + 0x248))
            (peVar5,&local_350,&local_360,0,&local_140,&local_1c8);
  if (local_358 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358);
  }
  if (local_348 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_348);
  }
  this_03 = (this->actuator).
            super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x20);
  (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b2b660;
  local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  dVar1 = this->speed;
  local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__ChFunction_00b6c330;
  *(double *)
   &local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = dVar1;
  ChLinkMotorLinearSpeed::SetSpeedFunction(this_03,&local_2f8);
  if (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2f8.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  *(double *)
   &(((this->actuator).
      super___shared_ptr<chrono::ChLinkMotorLinearSpeed,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_ChLinkMotorLinear).field_0x278 = this->h;
  if (local_378.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_378.
               super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

ChExtruderBeamIGA::ChExtruderBeamIGA(ChSystem* msystem,              // system to store the constraints
                                     std::shared_ptr<ChMesh> mmesh,  // mesh to store the resulting elements
                                     std::shared_ptr<ChBeamSectionCosserat> sect,  // section material for beam elements
                                     double mh,                                    // element length
                                     const ChCoordsys<> moutlet,  // outlet pos & orientation (x is extrusion direction)
                                     double mspeed,               // speed
                                     int morder                   // element order
) {
    beam_order = morder;
    h = mh;
    outlet = moutlet;
    mysystem = msystem;
    mesh = mmesh;
    beam_section = sect;
    mytime = 0;
    speed = mspeed;

    ground = chrono_types::make_shared<ChBody>();
    ground->SetBodyFixed(true);
    mysystem->Add(ground);

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzrot>(ChFrame<>(outlet));
    nodeA->SetPos_dt(outlet.TransformDirectionLocalToParent(VECT_X * this->speed));
    nodeA->SetX0(ChFrame<>());
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    // p+1 repeated end knots for the start
    for (int i = 0; i < this->beam_order + 1; ++i) {
        beam_knots.push_back(101.);
    }
    beam_knots.push_back(100.);

    GetLog() << "Create node n." << beam_nodes.size() << " at x=" << nodeA->GetPos().x()
             << " x0=" << nodeA->GetX0().GetPos().x() << "\n";

    actuator = chrono_types::make_shared<ChLinkMotorLinearSpeed>();
    mysystem->Add(actuator);
    actuator->Initialize(nodeA, ground, false, ChFrame<>(outlet), ChFrame<>(outlet));
    actuator->SetSpeedFunction(chrono_types::make_shared<ChFunction_Const>(this->speed));
    actuator->SetMotionOffset(this->h);
}